

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asmap.cpp
# Opt level: O3

bool SanityCheckASMap(vector<bool,_std::allocator<bool>_> *asmap,int bits)

{
  uint uVar1;
  ulong *puVar2;
  pointer ppVar3;
  pointer ppVar4;
  uint32_t uVar5;
  ulong *puVar6;
  ulong *puVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  long in_FS_OFFSET;
  bool bVar12;
  uint32_t jump_offset;
  vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_> jumps;
  uint local_7c;
  vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_> local_78;
  int local_5c;
  const_iterator local_58;
  const_iterator local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  puVar7 = (asmap->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p;
  puVar2 = (asmap->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
           _M_finish.super__Bit_iterator_base._M_p;
  uVar1 = (asmap->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._M_offset;
  local_58.super__Bit_iterator_base._M_offset = 0;
  local_78.
  super__Vector_base<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.
  super__Vector_base<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_5c = bits;
  local_58.super__Bit_iterator_base._M_p = puVar7;
  local_48.super__Bit_iterator_base._M_p = puVar2;
  local_48.super__Bit_iterator_base._M_offset = uVar1;
  std::vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>::reserve
            (&local_78,(long)bits);
  uVar8 = 0;
  if (puVar7 != puVar2 || uVar1 != 0) {
    iVar9 = 1;
    bVar12 = false;
    puVar6 = puVar7;
    do {
      ppVar4 = local_78.
               super__Vector_base<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      ppVar3 = local_78.
               super__Vector_base<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      iVar11 = (int)puVar7;
      if ((local_78.
           super__Vector_base<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start !=
           local_78.
           super__Vector_base<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_finish) &&
         (local_78.
          super__Vector_base<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
          ._M_impl.super__Vector_impl_data._M_finish[-1].first <= uVar8 + ((int)puVar6 - iVar11) * 8
         )) break;
      uVar8 = 0;
      uVar5 = anon_unknown.dwarf_304d2fc::DecodeBits
                        (&local_58,&local_48,'\0',
                         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         (anonymous_namespace)::TYPE_BIT_SIZES);
      switch(uVar5) {
      case 0:
        if ((iVar9 != 3) &&
           (uVar5 = anon_unknown.dwarf_304d2fc::DecodeBits
                              (&local_58,&local_48,'\x01',
                               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                               (anonymous_namespace)::ASN_BIT_SIZES), uVar5 != 0xffffffff)) {
          if (ppVar3 == ppVar4) {
            uVar10 = (ulong)local_58.super__Bit_iterator_base._M_offset;
            if ((long)((uVar1 - uVar10) +
                      ((long)puVar2 - (long)local_58.super__Bit_iterator_base._M_p) * 8) < 8) {
              uVar8 = 1;
              if (local_58.super__Bit_iterator_base._M_p == puVar2 &&
                  local_58.super__Bit_iterator_base._M_offset == uVar1)
              goto switchD_0075640c_default;
              puVar7 = local_58.super__Bit_iterator_base._M_p;
              goto LAB_00756650;
            }
          }
          else if (ppVar4[-1].first ==
                   ((int)local_58.super__Bit_iterator_base._M_p - iVar11) * 8 +
                   local_58.super__Bit_iterator_base._M_offset) {
            local_5c = ppVar4[-1].second;
            local_78.
            super__Vector_base<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = ppVar4 + -1;
            goto LAB_0075657c;
          }
        }
        goto LAB_007565df;
      case 1:
        uVar5 = anon_unknown.dwarf_304d2fc::DecodeBits
                          (&local_58,&local_48,'\x11',
                           (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           (anonymous_namespace)::JUMP_BIT_SIZES);
        if (((uVar5 == 0xffffffff) ||
            ((long)(((ulong)uVar1 - (ulong)local_58.super__Bit_iterator_base._M_offset) +
                   ((long)puVar2 - (long)local_58.super__Bit_iterator_base._M_p) * 8) <
             (long)(ulong)uVar5)) || (local_5c == 0)) goto LAB_007565df;
        local_5c = local_5c + -1;
        local_7c = local_58.super__Bit_iterator_base._M_offset + uVar5 +
                   ((int)local_58.super__Bit_iterator_base._M_p - iVar11) * 8;
        if ((ppVar3 != ppVar4) && (ppVar4[-1].first <= local_7c)) goto LAB_007565df;
        std::vector<std::pair<unsigned_int,int>,std::allocator<std::pair<unsigned_int,int>>>::
        emplace_back<unsigned_int&,int&>
                  ((vector<std::pair<unsigned_int,int>,std::allocator<std::pair<unsigned_int,int>>>
                    *)&local_78,&local_7c,&local_5c);
LAB_0075657c:
        iVar9 = 1;
        break;
      case 2:
        uVar5 = anon_unknown.dwarf_304d2fc::DecodeBits
                          (&local_58,&local_48,'\x02',
                           (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           (anonymous_namespace)::MATCH_BIT_SIZES);
        if (uVar5 == 0xffffffff) goto LAB_007565df;
        if (uVar5 == 0) {
          uVar8 = 0x20;
        }
        else {
          uVar8 = 0x1f;
          if (uVar5 != 0) {
            for (; uVar5 >> uVar8 == 0; uVar8 = uVar8 - 1) {
            }
          }
          uVar8 = uVar8 ^ 0x1f;
        }
        if (((bool)(bVar12 & (iVar9 == 2 && uVar5 < 0x100))) || (local_5c < (int)(0x1f - uVar8)))
        goto LAB_007565df;
        iVar9 = 2;
        local_5c = local_5c - (0x1f - uVar8);
        bVar12 = uVar5 < 0x100;
        break;
      case 3:
        if (iVar9 == 3) goto LAB_007565df;
        uVar5 = anon_unknown.dwarf_304d2fc::DecodeBits
                          (&local_58,&local_48,'\x01',
                           (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           (anonymous_namespace)::ASN_BIT_SIZES);
        iVar9 = 3;
        if (uVar5 == 0xffffffff) goto LAB_007565df;
        break;
      default:
        goto switchD_0075640c_default;
      }
      puVar6 = local_58.super__Bit_iterator_base._M_p;
      uVar8 = local_58.super__Bit_iterator_base._M_offset;
    } while (local_58.super__Bit_iterator_base._M_offset != uVar1 ||
             local_58.super__Bit_iterator_base._M_p != puVar2);
LAB_007565df:
    uVar8 = 0;
  }
  goto switchD_0075640c_default;
  while( true ) {
    iVar9 = (int)uVar10;
    uVar10 = (ulong)(iVar9 + 1);
    if (iVar9 == 0x3f) {
      uVar10 = 0;
    }
    puVar7 = puVar7 + (iVar9 == 0x3f);
    if (puVar7 == puVar2 && (uint)uVar10 == uVar1) break;
LAB_00756650:
    bVar12 = (*puVar7 & 1L << ((byte)uVar10 & 0x3f)) == 0;
    uVar8 = (uint)bVar12;
    if (!bVar12) break;
  }
switchD_0075640c_default:
  if (local_78.
      super__Vector_base<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.
                    super__Vector_base<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_78.
                          super__Vector_base<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.
                          super__Vector_base<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return SUB41(uVar8,0);
}

Assistant:

bool SanityCheckASMap(const std::vector<bool>& asmap, int bits)
{
    const std::vector<bool>::const_iterator begin = asmap.begin(), endpos = asmap.end();
    std::vector<bool>::const_iterator pos = begin;
    std::vector<std::pair<uint32_t, int>> jumps; // All future positions we may jump to (bit offset in asmap -> bits to consume left)
    jumps.reserve(bits);
    Instruction prevopcode = Instruction::JUMP;
    bool had_incomplete_match = false;
    while (pos != endpos) {
        uint32_t offset = pos - begin;
        if (!jumps.empty() && offset >= jumps.back().first) return false; // There was a jump into the middle of the previous instruction
        Instruction opcode = DecodeType(pos, endpos);
        if (opcode == Instruction::RETURN) {
            if (prevopcode == Instruction::DEFAULT) return false; // There should not be any RETURN immediately after a DEFAULT (could be combined into just RETURN)
            uint32_t asn = DecodeASN(pos, endpos);
            if (asn == INVALID) return false; // ASN straddles EOF
            if (jumps.empty()) {
                // Nothing to execute anymore
                if (endpos - pos > 7) return false; // Excessive padding
                while (pos != endpos) {
                    if (*pos) return false; // Nonzero padding bit
                    ++pos;
                }
                return true; // Sanely reached EOF
            } else {
                // Continue by pretending we jumped to the next instruction
                offset = pos - begin;
                if (offset != jumps.back().first) return false; // Unreachable code
                bits = jumps.back().second; // Restore the number of bits we would have had left after this jump
                jumps.pop_back();
                prevopcode = Instruction::JUMP;
            }
        } else if (opcode == Instruction::JUMP) {
            uint32_t jump = DecodeJump(pos, endpos);
            if (jump == INVALID) return false; // Jump offset straddles EOF
            if (int64_t{jump} > int64_t{endpos - pos}) return false; // Jump out of range
            if (bits == 0) return false; // Consuming bits past the end of the input
            --bits;
            uint32_t jump_offset = pos - begin + jump;
            if (!jumps.empty() && jump_offset >= jumps.back().first) return false; // Intersecting jumps
            jumps.emplace_back(jump_offset, bits);
            prevopcode = Instruction::JUMP;
        } else if (opcode == Instruction::MATCH) {
            uint32_t match = DecodeMatch(pos, endpos);
            if (match == INVALID) return false; // Match bits straddle EOF
            int matchlen = std::bit_width(match) - 1;
            if (prevopcode != Instruction::MATCH) had_incomplete_match = false;
            if (matchlen < 8 && had_incomplete_match) return false; // Within a sequence of matches only at most one should be incomplete
            had_incomplete_match = (matchlen < 8);
            if (bits < matchlen) return false; // Consuming bits past the end of the input
            bits -= matchlen;
            prevopcode = Instruction::MATCH;
        } else if (opcode == Instruction::DEFAULT) {
            if (prevopcode == Instruction::DEFAULT) return false; // There should not be two successive DEFAULTs (they could be combined into one)
            uint32_t asn = DecodeASN(pos, endpos);
            if (asn == INVALID) return false; // ASN straddles EOF
            prevopcode = Instruction::DEFAULT;
        } else {
            return false; // Instruction straddles EOF
        }
    }
    return false; // Reached EOF without RETURN instruction
}